

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueConverter.cpp
# Opt level: O0

void helics::detail::convertFromBinary(byte *data,vector<double,_std::allocator<double>_> *val)

{
  bool bVar1;
  vector<double,_std::allocator<double>_> *this;
  double *__dest;
  byte *in_RDI;
  double *element;
  iterator __end3;
  iterator __begin3;
  vector<double,_std::allocator<double>_> *__range3;
  size_t size;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffffb8;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  *in_stack_ffffffffffffffc0;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_30;
  size_type in_stack_ffffffffffffffd8;
  
  this = (vector<double,_std::allocator<double>_> *)getDataSize(in_RDI);
  std::vector<double,_std::allocator<double>_>::resize(this,in_stack_ffffffffffffffd8);
  if (this != (vector<double,_std::allocator<double>_> *)0x0) {
    __dest = std::vector<double,_std::allocator<double>_>::data
                       ((vector<double,_std::allocator<double>_> *)0x450a5e);
    memcpy(__dest,in_RDI + 8,(long)this << 3);
  }
  if ((*in_RDI & 1) != 0) {
    local_30._M_current =
         (double *)std::vector<double,_std::allocator<double>_>::begin(in_stack_ffffffffffffffb8);
    std::vector<double,_std::allocator<double>_>::end(in_stack_ffffffffffffffb8);
    while (bVar1 = __gnu_cxx::operator==<double_*,_std::vector<double,_std::allocator<double>_>_>
                             (in_stack_ffffffffffffffc0,
                              (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                               *)in_stack_ffffffffffffffb8), ((bVar1 ^ 0xffU) & 1) != 0) {
      in_stack_ffffffffffffffc0 =
           (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> *)
           __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
           operator*(&local_30);
      checks::swapBytes<8ul>((byte *)in_stack_ffffffffffffffc0);
      __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
      operator++(&local_30);
    }
  }
  return;
}

Assistant:

void convertFromBinary(const std::byte* data, std::vector<double>& val)
{
    const std::size_t size = getDataSize(data);
    val.resize(size);
    if (size > 0) {
        std::memcpy(val.data(), data + 8, size * sizeof(double));
    }
    if ((data[0] & endianMask) != littleEndianCode) {
        for (auto& element : val) {
            checks::swapBytes<8>(reinterpret_cast<std::byte*>(&element));
        }
    }
}